

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O2

bool __thiscall dap::json::JsonCppDeserializer::deserialize(JsonCppDeserializer *this,any *v)

{
  bool bVar1;
  ValueType VVar2;
  int iVar3;
  object obj;
  undefined1 local_48 [32];
  float local_28;
  size_t local_20;
  __node_base_ptr p_Stack_18;
  
  bVar1 = Json::Value::isBool(this->json);
  if (bVar1) {
    bVar1 = Json::Value::asBool(this->json);
    local_48[0] = bVar1;
    any::operator=(v,(boolean *)local_48);
  }
  else {
    VVar2 = Json::Value::type(this->json);
    if (VVar2 == realValue) {
      local_48._0_8_ = Json::Value::asDouble(this->json);
      any::operator=(v,(number *)local_48);
    }
    else {
      bVar1 = Json::Value::isInt64(this->json);
      if (bVar1) {
        local_48._0_8_ = Json::Value::asInt64(this->json);
        any::operator=(v,(integer *)local_48);
      }
      else {
        bVar1 = Json::Value::isString(this->json);
        if (bVar1) {
          Json::Value::asString_abi_cxx11_((String *)local_48,this->json);
          any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
          std::__cxx11::string::~string((string *)local_48);
        }
        else {
          bVar1 = Json::Value::isObject(this->json);
          if (bVar1) {
            local_48._0_8_ = &p_Stack_18;
            local_48._8_8_ = (pointer)0x1;
            local_48._16_8_ = 0;
            local_48._24_8_ = 0;
            local_28 = 1.0;
            local_20 = 0;
            p_Stack_18 = (__node_base_ptr)0x0;
            iVar3 = (*(this->super_Deserializer)._vptr_Deserializer[6])(this,local_48);
            if ((char)iVar3 == '\0') {
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_48);
              return false;
            }
            any::operator=(v,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
                              *)local_48);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_48);
          }
          else {
            bVar1 = Json::Value::isArray(this->json);
            if (bVar1) {
              local_48._0_8_ = (pointer)0x0;
              local_48._8_8_ = (pointer)0x0;
              local_48._16_8_ = 0;
              bVar1 = Deserializer::deserialize<dap::any>
                                (&this->super_Deserializer,(array<dap::any> *)local_48);
              if (!bVar1) {
                std::vector<dap::any,_std::allocator<dap::any>_>::~vector
                          ((vector<dap::any,_std::allocator<dap::any>_> *)local_48);
                return false;
              }
              any::operator=(v,(vector<dap::any,_std::allocator<dap::any>_> *)local_48);
              std::vector<dap::any,_std::allocator<dap::any>_>::~vector
                        ((vector<dap::any,_std::allocator<dap::any>_> *)local_48);
            }
            else {
              bVar1 = Json::Value::isNull(this->json);
              if (!bVar1) {
                return false;
              }
              any::reset(v);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool JsonCppDeserializer::deserialize(dap::any* v) const {
  if (json->isBool()) {
    *v = dap::boolean(json->asBool());
  } else if (json->type() == Json::ValueType::realValue) {
    // json->isDouble() returns true for integers as well, so we need to
    // explicitly look for the realValue type.
    *v = dap::number(json->asDouble());
  } else if (json->isInt64()) {
    *v = dap::integer(json->asInt64());
  } else if (json->isString()) {
    *v = json->asString();
  } else if (json->isObject()) {
    dap::object obj;
    if (!deserialize(&obj)) {
      return false;
    }
    *v = obj;
  } else if (json->isArray()) {
    dap::array<any> arr;
    if (!deserialize(&arr)) {
      return false;
    }
    *v = arr;
  } else if (json->isNull()) {
    *v = null();
  } else {
    return false;
  }
  return true;
}